

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.cpp
# Opt level: O3

size_t duckdb_zstd::FSE_decompress_wksp_bmi2
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize,int bmi2)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  undefined1 *puVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  FSE_DTable *dt;
  ulong uVar16;
  ulong uVar17;
  ulong *puVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  uint tableLog;
  BIT_DStream_t bitD;
  FSE_DState_t state1;
  uint local_9c [4];
  uint local_8c;
  BIT_DStream_t local_88;
  FSE_DState_t local_50;
  FSE_DState_t local_40;
  
  if (bmi2 != 0) {
    sVar5 = FSE_decompress_wksp_body_bmi2(dst,dstCapacity,cSrc,cSrcSize,maxLog,workSpace,wkspSize);
    return sVar5;
  }
  local_9c[0] = 0xff;
  sVar5 = 0xffffffffffffffff;
  if ((((0x1ff < wkspSize) &&
       (sVar6 = FSE_readNCount_bmi2((short *)workSpace,local_9c,&local_8c,cSrc,cSrcSize,0),
       sVar5 = sVar6, sVar6 < 0xffffffffffffff89)) &&
      (sVar5 = 0xffffffffffffffd4, local_8c <= maxLog)) &&
     (lVar13 = (long)(1 << ((byte)local_8c & 0x1f)),
     ((1L << ((byte)local_8c & 0x3f)) + lVar13 * 4 + (ulong)(local_9c[0] + 1) * 2 + 0x13 &
     0xfffffffffffffffc) + 0x204 <= wkspSize)) {
    dt = (FSE_DTable *)((long)workSpace + 0x200);
    sVar5 = FSE_buildDTable_internal
                      (dt,(short *)workSpace,local_9c[0],local_8c,dt + lVar13 + 1,
                       (wkspSize - (lVar13 * 4 + 4)) - 0x200);
    if (sVar5 < 0xffffffffffffff89) {
      puVar18 = (ulong *)((long)cSrc + sVar6);
      sVar6 = cSrcSize - sVar6;
      puVar9 = (undefined1 *)((long)dst + (dstCapacity - 3));
      if (*(short *)((long)workSpace + 0x202) == 0) {
        sVar5 = BIT_initDStream(&local_88,puVar18,sVar6);
        if (sVar5 < 0xffffffffffffff89) {
          FSE_initDState(&local_40,&local_88,dt);
          FSE_initDState(&local_50,&local_88,dt);
          iVar19 = (int)local_88.start;
          puVar14 = (undefined1 *)dst;
          puVar18 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
          if (local_88.bitsConsumed < 0x41) {
            do {
              if (local_88.ptr < local_88.limitPtr) {
                puVar18 = (ulong *)local_88.ptr;
                if (local_88.ptr == local_88.start) break;
                bVar21 = local_88.start <=
                         (ulong *)((long)local_88.ptr - (ulong)(local_88.bitsConsumed >> 3));
                uVar8 = (int)local_88.ptr - iVar19;
                if (bVar21) {
                  uVar8 = local_88.bitsConsumed >> 3;
                }
                local_88.bitsConsumed = local_88.bitsConsumed + uVar8 * -8;
              }
              else {
                uVar8 = local_88.bitsConsumed >> 3;
                local_88.bitsConsumed = local_88.bitsConsumed & 7;
                bVar21 = true;
              }
              local_88.ptr = (char *)((long)local_88.ptr - (ulong)uVar8);
              local_88.bitContainer = *(BitContainerType *)local_88.ptr;
              puVar18 = (ulong *)local_88.ptr;
              if ((puVar9 <= puVar14) || (!bVar21)) break;
              bVar1 = *(byte *)((long)local_40.table + local_40.state * 4 + 3);
              iVar10 = local_88.bitsConsumed + bVar1;
              uVar17 = (ulong)*(ushort *)((long)local_40.table + local_40.state * 4);
              uVar20 = (-1L << (bVar1 & 0x3f) ^ 0xffffffffffffffffU) &
                       local_88.bitContainer >> (-(char)iVar10 & 0x3fU);
              *puVar14 = *(undefined1 *)((long)local_40.table + local_40.state * 4 + 2);
              uVar16 = (ulong)*(ushort *)((long)local_50.table + local_50.state * 4);
              bVar1 = *(byte *)((long)local_50.table + local_50.state * 4 + 3);
              iVar10 = iVar10 + (uint)bVar1;
              uVar12 = (-1L << (bVar1 & 0x3f) ^ 0xffffffffffffffffU) &
                       local_88.bitContainer >> (-(char)iVar10 & 0x3fU);
              puVar14[1] = *(undefined1 *)((long)local_50.table + local_50.state * 4 + 2);
              bVar1 = *(byte *)((long)local_40.table + uVar17 * 4 + uVar20 * 4 + 3);
              iVar10 = iVar10 + (uint)bVar1;
              puVar18 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
              local_40.state =
                   (~(-1L << (bVar1 & 0x3f)) & local_88.bitContainer >> (-(char)iVar10 & 0x3fU)) +
                   (ulong)*(ushort *)((long)local_40.table + uVar17 * 4 + uVar20 * 4);
              puVar14[2] = *(undefined1 *)((long)local_40.table + uVar17 * 4 + uVar20 * 4 + 2);
              bVar1 = *(byte *)((long)local_50.table + uVar16 * 4 + uVar12 * 4 + 3);
              local_88.bitsConsumed = iVar10 + (uint)bVar1;
              local_50.state =
                   (~(-1L << (bVar1 & 0x3f)) &
                   local_88.bitContainer >> (-(char)local_88.bitsConsumed & 0x3fU)) +
                   (ulong)*(ushort *)((long)local_50.table + uVar16 * 4 + uVar12 * 4);
              puVar14[3] = *(undefined1 *)((long)local_50.table + uVar16 * 4 + uVar12 * 4 + 2);
              puVar14 = puVar14 + 4;
              if (0x40 < local_88.bitsConsumed) break;
            } while( true );
          }
          puVar9 = (undefined1 *)((long)dst + (dstCapacity - 2));
          sVar5 = 0xffffffffffffffba;
          if (puVar14 <= puVar9) {
            lVar13 = (long)puVar14 - (long)dst;
            puVar14 = puVar14 + 1;
            do {
              uVar3 = *(ushort *)((long)local_40.table + local_40.state * 4);
              bVar1 = *(byte *)((long)local_40.table + local_40.state * 4 + 3);
              local_88.bitsConsumed = local_88.bitsConsumed + bVar1;
              uVar12 = local_88.bitContainer >> (-(char)local_88.bitsConsumed & 0x3fU);
              puVar14[-1] = *(undefined1 *)((long)local_40.table + local_40.state * 4 + 2);
              if (0x40 < local_88.bitsConsumed) {
                local_40.table = (void *)((long)local_50.table + local_50.state * 4);
                lVar7 = 2;
                goto LAB_0128f122;
              }
              if (puVar18 < local_88.limitPtr) {
                if (puVar18 != (ulong *)local_88.start) {
                  uVar8 = (int)puVar18 - iVar19;
                  if (local_88.start <=
                      (ulong *)((long)puVar18 - (ulong)(local_88.bitsConsumed >> 3))) {
                    uVar8 = local_88.bitsConsumed >> 3;
                  }
                  local_88.bitsConsumed = local_88.bitsConsumed + uVar8 * -8;
                  goto LAB_0128eec3;
                }
              }
              else {
                uVar8 = local_88.bitsConsumed >> 3;
                local_88.bitsConsumed = local_88.bitsConsumed & 7;
LAB_0128eec3:
                puVar18 = (ulong *)((long)puVar18 - (ulong)uVar8);
                local_88.bitContainer = *puVar18;
              }
              if (puVar9 < puVar14) {
                return 0xffffffffffffffba;
              }
              uVar4 = *(ushort *)((long)local_50.table + local_50.state * 4);
              bVar2 = *(byte *)((long)local_50.table + local_50.state * 4 + 3);
              local_88.bitsConsumed = local_88.bitsConsumed + bVar2;
              uVar16 = local_88.bitContainer >> (-(char)local_88.bitsConsumed & 0x3fU);
              local_40.state = (uVar12 & ~(-1L << (bVar1 & 0x3f))) + (ulong)uVar3;
              *puVar14 = *(undefined1 *)((long)local_50.table + local_50.state * 4 + 2);
              if (0x40 < local_88.bitsConsumed) {
                local_40.table = (void *)((long)local_40.table + local_40.state * 4);
                puVar14 = puVar14 + 1;
                lVar7 = 3;
LAB_0128f122:
                *puVar14 = *(undefined1 *)((long)local_40.table + 2);
                return lVar7 + lVar13;
              }
              if (puVar18 < local_88.limitPtr) {
                if (puVar18 != (ulong *)local_88.start) {
                  uVar8 = (int)puVar18 - iVar19;
                  if (local_88.start <=
                      (ulong *)((long)puVar18 - (ulong)(local_88.bitsConsumed >> 3))) {
                    uVar8 = local_88.bitsConsumed >> 3;
                  }
                  local_88.bitsConsumed = local_88.bitsConsumed + uVar8 * -8;
                  goto LAB_0128ef4d;
                }
              }
              else {
                uVar8 = local_88.bitsConsumed >> 3;
                local_88.bitsConsumed = local_88.bitsConsumed & 7;
LAB_0128ef4d:
                puVar18 = (ulong *)((long)puVar18 - (ulong)uVar8);
                local_88.bitContainer = *puVar18;
              }
              local_50.state = (uVar16 & ~(-1L << (bVar2 & 0x3f))) + (ulong)uVar4;
              lVar13 = lVar13 + 2;
              puVar15 = puVar14 + 1;
              puVar14 = puVar14 + 2;
            } while (puVar15 <= puVar9);
          }
        }
      }
      else if (sVar6 == 0) {
        sVar5 = 0xffffffffffffffb8;
      }
      else {
        local_88.limitPtr = (char *)(puVar18 + 1);
        if (sVar6 < 8) {
          local_88.bitContainer = (BitContainerType)(byte)*puVar18;
          switch(sVar6) {
          case 7:
            local_88.bitContainer =
                 local_88.bitContainer | (ulong)*(byte *)((long)puVar18 + 6) << 0x30;
          case 6:
            local_88.bitContainer =
                 local_88.bitContainer + ((ulong)*(byte *)((long)puVar18 + 5) << 0x28);
          case 5:
            local_88.bitContainer =
                 local_88.bitContainer + ((ulong)*(byte *)((long)puVar18 + 4) << 0x20);
          case 4:
            local_88.bitContainer =
                 local_88.bitContainer + (ulong)*(byte *)((long)puVar18 + 3) * 0x1000000;
          case 3:
            local_88.bitContainer =
                 local_88.bitContainer + (ulong)*(byte *)((long)puVar18 + 2) * 0x10000;
          case 2:
            local_88.bitContainer =
                 (ulong)*(byte *)((long)puVar18 + 1) * 0x100 + local_88.bitContainer;
          }
          bVar1 = *(byte *)((long)cSrc + (cSrcSize - 1));
          if (bVar1 == 0) {
            return 0xffffffffffffffec;
          }
          uVar8 = 0x1f;
          if (bVar1 != 0) {
            for (; bVar1 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          local_88.bitsConsumed = (uVar8 ^ 0x1f) + (int)sVar6 * -8 + 0x29;
          local_88.ptr = (char *)puVar18;
        }
        else {
          local_88.ptr = (char *)((long)cSrc + (cSrcSize - 8));
          local_88.bitContainer = *(BitContainerType *)local_88.ptr;
          if (local_88.bitContainer >> 0x38 == 0) {
            return 0xffffffffffffffff;
          }
          uVar8 = 0x1f;
          bVar1 = (byte)(local_88.bitContainer >> 0x38);
          if (bVar1 != 0) {
            for (; bVar1 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          local_88.bitsConsumed = ~uVar8 + 9;
          if (0xffffffffffffff88 < sVar6) {
            return sVar6;
          }
        }
        local_88.start = (char *)puVar18;
        FSE_initDState(&local_40,&local_88,dt);
        FSE_initDState(&local_50,&local_88,dt);
        iVar19 = (int)local_88.start;
        puVar14 = (undefined1 *)dst;
        puVar18 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
        if (local_88.bitsConsumed < 0x41) {
          do {
            if (local_88.ptr < local_88.limitPtr) {
              puVar18 = (ulong *)local_88.ptr;
              if (local_88.ptr == local_88.start) break;
              bVar21 = local_88.start <=
                       (ulong *)((long)local_88.ptr - (ulong)(local_88.bitsConsumed >> 3));
              uVar8 = (int)local_88.ptr - iVar19;
              if (bVar21) {
                uVar8 = local_88.bitsConsumed >> 3;
              }
              local_88.bitsConsumed = local_88.bitsConsumed + uVar8 * -8;
            }
            else {
              uVar8 = local_88.bitsConsumed >> 3;
              local_88.bitsConsumed = local_88.bitsConsumed & 7;
              bVar21 = true;
            }
            local_88.ptr = (char *)((long)local_88.ptr - (ulong)uVar8);
            local_88.bitContainer = *(BitContainerType *)local_88.ptr;
            puVar18 = (ulong *)local_88.ptr;
            if ((puVar9 <= puVar14) || (!bVar21)) break;
            uVar17 = (ulong)*(ushort *)((long)local_40.table + local_40.state * 4);
            bVar1 = *(byte *)((long)local_40.table + local_40.state * 4 + 3);
            iVar10 = local_88.bitsConsumed + bVar1;
            uVar16 = (local_88.bitContainer << ((byte)local_88.bitsConsumed & 0x3f)) >>
                     (-bVar1 & 0x3f);
            *puVar14 = *(undefined1 *)((long)local_40.table + local_40.state * 4 + 2);
            uVar20 = (ulong)*(ushort *)((long)local_50.table + local_50.state * 4);
            bVar1 = *(byte *)((long)local_50.table + local_50.state * 4 + 3);
            iVar11 = iVar10 + (uint)bVar1;
            uVar12 = (local_88.bitContainer << ((byte)iVar10 & 0x3f)) >> (-bVar1 & 0x3f);
            puVar14[1] = *(undefined1 *)((long)local_50.table + local_50.state * 4 + 2);
            bVar1 = *(byte *)((long)local_40.table + uVar17 * 4 + uVar16 * 4 + 3);
            iVar10 = iVar11 + (uint)bVar1;
            local_40.state =
                 ((local_88.bitContainer << ((byte)iVar11 & 0x3f)) >> (-bVar1 & 0x3f)) +
                 (ulong)*(ushort *)((long)local_40.table + uVar17 * 4 + uVar16 * 4);
            puVar14[2] = *(undefined1 *)((long)local_40.table + uVar17 * 4 + uVar16 * 4 + 2);
            bVar1 = *(byte *)((long)local_50.table + uVar20 * 4 + uVar12 * 4 + 3);
            local_88.bitsConsumed = iVar10 + (uint)bVar1;
            local_50.state =
                 ((local_88.bitContainer << ((byte)iVar10 & 0x3f)) >> (-bVar1 & 0x3f)) +
                 (ulong)*(ushort *)((long)local_50.table + uVar20 * 4 + uVar12 * 4);
            puVar14[3] = *(undefined1 *)((long)local_50.table + uVar20 * 4 + uVar12 * 4 + 2);
            puVar14 = puVar14 + 4;
            puVar18 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
            if (0x40 < local_88.bitsConsumed) break;
          } while( true );
        }
        puVar9 = (undefined1 *)((long)dst + (dstCapacity - 2));
        sVar5 = 0xffffffffffffffba;
        if (puVar14 <= puVar9) {
          lVar13 = (long)puVar14 - (long)dst;
          puVar14 = puVar14 + 1;
          do {
            uVar3 = *(ushort *)((long)local_40.table + local_40.state * 4);
            bVar1 = *(byte *)((long)local_40.table + local_40.state * 4 + 3);
            uVar12 = local_88.bitContainer << ((byte)local_88.bitsConsumed & 0x3f);
            local_88.bitsConsumed = local_88.bitsConsumed + bVar1;
            puVar14[-1] = *(undefined1 *)((long)local_40.table + local_40.state * 4 + 2);
            if (0x40 < local_88.bitsConsumed) {
              local_40.table = (void *)((long)local_50.table + local_50.state * 4);
              lVar7 = 2;
              goto LAB_0128f14f;
            }
            if (puVar18 < local_88.limitPtr) {
              if (puVar18 != (ulong *)local_88.start) {
                uVar8 = (int)puVar18 - iVar19;
                if (local_88.start <= (ulong *)((long)puVar18 - (ulong)(local_88.bitsConsumed >> 3))
                   ) {
                  uVar8 = local_88.bitsConsumed >> 3;
                }
                local_88.bitsConsumed = local_88.bitsConsumed + uVar8 * -8;
                goto LAB_0128f02d;
              }
            }
            else {
              uVar8 = local_88.bitsConsumed >> 3;
              local_88.bitsConsumed = local_88.bitsConsumed & 7;
LAB_0128f02d:
              puVar18 = (ulong *)((long)puVar18 - (ulong)uVar8);
              local_88.bitContainer = *puVar18;
            }
            if (puVar9 < puVar14) {
              return 0xffffffffffffffba;
            }
            uVar4 = *(ushort *)((long)local_50.table + local_50.state * 4);
            bVar2 = *(byte *)((long)local_50.table + local_50.state * 4 + 3);
            uVar16 = local_88.bitContainer << ((byte)local_88.bitsConsumed & 0x3f);
            local_88.bitsConsumed = local_88.bitsConsumed + bVar2;
            local_40.state = (uVar12 >> (-bVar1 & 0x3f)) + (ulong)uVar3;
            *puVar14 = *(undefined1 *)((long)local_50.table + local_50.state * 4 + 2);
            if (0x40 < local_88.bitsConsumed) {
              local_40.table = (void *)((long)local_40.table + local_40.state * 4);
              puVar14 = puVar14 + 1;
              lVar7 = 3;
LAB_0128f14f:
              *puVar14 = *(undefined1 *)((long)local_40.table + 2);
              return lVar7 + lVar13;
            }
            if (puVar18 < local_88.limitPtr) {
              if (puVar18 != (ulong *)local_88.start) {
                uVar8 = (int)puVar18 - iVar19;
                if (local_88.start <= (ulong *)((long)puVar18 - (ulong)(local_88.bitsConsumed >> 3))
                   ) {
                  uVar8 = local_88.bitsConsumed >> 3;
                }
                local_88.bitsConsumed = local_88.bitsConsumed + uVar8 * -8;
                goto LAB_0128f0b0;
              }
            }
            else {
              uVar8 = local_88.bitsConsumed >> 3;
              local_88.bitsConsumed = local_88.bitsConsumed & 7;
LAB_0128f0b0:
              puVar18 = (ulong *)((long)puVar18 - (ulong)uVar8);
              local_88.bitContainer = *puVar18;
            }
            local_50.state = (uVar16 >> (-bVar2 & 0x3f)) + (ulong)uVar4;
            lVar13 = lVar13 + 2;
            puVar15 = puVar14 + 1;
            puVar14 = puVar14 + 2;
          } while (puVar15 <= puVar9);
        }
      }
    }
  }
  return sVar5;
}

Assistant:

size_t FSE_decompress_wksp_bmi2(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_decompress_wksp_body_bmi2(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
    }
#endif
    (void)bmi2;
    return FSE_decompress_wksp_body_default(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
}